

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::StartAgain(cmCTestRunTest *this)

{
  bool bVar1;
  undefined1 local_38 [8];
  cmWorkingDirectory workdir;
  cmCTestRunTest *this_local;
  
  bVar1 = (this->RunAgain & 1U) != 0;
  if (bVar1) {
    this->RunAgain = false;
    workdir.OldDir.field_2._8_8_ = this;
    cmWorkingDirectory::cmWorkingDirectory
              ((cmWorkingDirectory *)local_38,&this->TestProperties->Directory);
    StartTest(this,this->TotalNumberOfTests);
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_38);
  }
  return bVar1;
}

Assistant:

bool cmCTestRunTest::StartAgain()
{
  if (!this->RunAgain) {
    return false;
  }
  this->RunAgain = false; // reset
  // change to tests directory
  cmWorkingDirectory workdir(this->TestProperties->Directory);
  this->StartTest(this->TotalNumberOfTests);
  return true;
}